

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_io.cpp
# Opt level: O0

bool __thiscall ON_BrepEdgeArray::Write(ON_BrepEdgeArray *this,ON_BinaryArchive *file)

{
  bool bVar1;
  int i_00;
  int iVar2;
  ON_BrepEdge *pOVar3;
  bool local_1d;
  int count;
  bool rc;
  int i;
  ON_BinaryArchive *file_local;
  ON_BrepEdgeArray *this_local;
  
  local_1d = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,0);
  if (local_1d) {
    local_1d = ON_BinaryArchive::Write3dmChunkVersion(file,1,0);
    i_00 = ON_ClassArray<ON_BrepEdge>::Count((ON_ClassArray<ON_BrepEdge> *)this);
    if (local_1d) {
      local_1d = ON_BinaryArchive::WriteInt(file,i_00);
    }
    for (count = 0; local_1d != false && count < i_00; count = count + 1) {
      if (local_1d != false) {
        pOVar3 = (this->super_ON_ObjectArray<ON_BrepEdge>).super_ON_ClassArray<ON_BrepEdge>.m_a +
                 count;
        iVar2 = (*(pOVar3->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
                  _vptr_ON_Object[10])(pOVar3,file);
        local_1d = (bool)((byte)iVar2 & 1);
      }
    }
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
    if (!bVar1) {
      local_1d = false;
    }
  }
  return local_1d;
}

Assistant:

bool ON_BrepEdgeArray::Write( ON_BinaryArchive& file ) const
{
  int i;
  bool rc = file.BeginWrite3dmChunk( TCODE_ANONYMOUS_CHUNK, 0 );
  if (rc) {
    rc = file.Write3dmChunkVersion(1,0);
    const int count = Count();
    if (rc) rc = file.WriteInt( count );
    for ( i = 0; rc && i < count; i++ ) {
      if (rc) rc = m_a[i].Write(file);
    }
    if ( !file.EndWrite3dmChunk() )
      rc = false;
  }
  return rc;
}